

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_attr_set_double(exr_context_t ctxt,int part_index,char *name,double val)

{
  exr_result_t eVar1;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar2;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  double local_28;
  
  local_30 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar1 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar1;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar2 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      list = (exr_attribute_list_t *)
             (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
      local_28 = val;
      eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&local_30);
      if (eVar1 == 0) {
        if (local_30->type != EXR_ATTR_DOUBLE) {
          eVar1 = (**(code **)(ctxt + 0x48))
                            (ctxt,0x10,
                             "\'%s\' requested type \'d\', but stored attributes is type \'%s\'",
                             name,local_30->type_name);
          return eVar1;
        }
      }
      else {
        if (eVar1 != 0xf) {
          return eVar1;
        }
        if (*ctxt != (_priv_exr_context_t)0x1) {
          return 0xf;
        }
        eVar1 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_DOUBLE,0,(uint8_t **)0x0,&local_30);
        if (eVar1 != 0) {
          return eVar1;
        }
      }
      (local_30->field_6).d = local_28;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar2 = 8;
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar2);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_double (
    exr_context_t ctxt, int part_index, const char* name, double val)
{
    ATTR_SET_IMPL (EXR_ATTR_DOUBLE, d);
}